

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_Mix_1in_2out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float baseVolume,float *src,
               float *dst,float *channelVolume,float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (toMix != 0) {
    fVar1 = *channelVolume;
    fVar2 = *coefficients;
    fVar3 = coefficients[1];
    lVar4 = 0;
    do {
      fVar5 = src[lVar4] * baseVolume * fVar1;
      fVar6 = fVar5 * fVar2 + dst[lVar4 * 2];
      fVar7 = 16777216.0;
      if ((fVar6 <= 16777216.0) && (fVar7 = -16777216.0, -16777216.0 <= fVar6)) {
        fVar7 = fVar6;
      }
      fVar5 = fVar5 * fVar3 + dst[lVar4 * 2 + 1];
      dst[lVar4 * 2] = fVar7;
      fVar7 = 16777216.0;
      if ((fVar5 <= 16777216.0) && (fVar7 = -16777216.0, -16777216.0 <= fVar5)) {
        fVar7 = fVar5;
      }
      dst[lVar4 * 2 + 1] = fVar7;
      lVar4 = lVar4 + 1;
    } while (toMix != (uint32_t)lVar4);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_2out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float baseVolume,
	float *restrict src,
	float *restrict dst,
	float *restrict channelVolume,
	float *restrict coefficients
) {
	uint32_t i;
	float totalVolume = baseVolume * channelVolume[0];
	for (i = 0; i < toMix; i += 1, src += 1, dst += 2)
	{
		/* Base source data... */
		const float sample = src[0] * totalVolume;

		/* ... combined with the coefficients... */
		dst[0] += sample * coefficients[0];
		dst[1] += sample * coefficients[1];

		/* ... then clamped. */
		dst[0] = FAudio_clamp(
			dst[0],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
		dst[1] = FAudio_clamp(
			dst[1],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
	}
}